

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O0

int __thiscall tsip::update_report(tsip *this)

{
  UINT8 UVar1;
  UINT16 UVar2;
  UINT32 UVar3;
  tsip *in_RDI;
  SINGLE SVar4;
  DOUBLE DVar5;
  int k_1;
  int k;
  int rlen;
  void *dst;
  void *src;
  int local_2c;
  int local_28;
  int local_24;
  int local_4;
  
  if ((in_RDI->verbose & 1U) != 0) {
    printf("Found Report: %x-%x\n",(ulong)(in_RDI->m_report).raw.data[0],
           (ulong)(in_RDI->m_report).raw.data[1]);
  }
  switch((in_RDI->m_report).raw.data[0]) {
  case 'B':
    *(ushort *)&in_RDI->m_updated = *(ushort *)&in_RDI->m_updated & 0xfffe | 1;
    (in_RDI->m_ecef_position_s).valid = true;
    local_24 = 0x10;
    (in_RDI->m_ecef_position_s).report.x =
         (float)(int)((uint)(in_RDI->m_report).raw.data[2] * 0x1000000 +
                      (uint)(in_RDI->m_report).raw.data[3] * 0x10000 +
                      (uint)(in_RDI->m_report).raw.data[4] * 0x100 +
                     (uint)(in_RDI->m_report).raw.data[5]);
    (in_RDI->m_ecef_position_s).report.y =
         (float)(int)((uint)(in_RDI->m_report).raw.data[6] * 0x1000000 +
                      (uint)(in_RDI->m_report).raw.data[7] * 0x10000 +
                      (uint)(in_RDI->m_report).raw.data[8] * 0x100 +
                     (uint)(in_RDI->m_report).raw.data[9]);
    (in_RDI->m_ecef_position_s).report.z =
         (float)(int)((uint)(in_RDI->m_report).raw.data[10] * 0x1000000 +
                      (uint)(in_RDI->m_report).raw.data[0xb] * 0x10000 +
                      (uint)(in_RDI->m_report).raw.data[0xc] * 0x100 +
                     (uint)(in_RDI->m_report).raw.data[0xd]);
    (in_RDI->m_ecef_position_s).report.time_of_fix =
         (float)(int)((uint)(in_RDI->m_report).raw.data[0xe] * 0x1000000 +
                      (uint)(in_RDI->m_report).raw.data[0xf] * 0x10000 +
                      (uint)(in_RDI->m_report).raw.data[0x10] * 0x100 +
                     (uint)(in_RDI->m_report).raw.data[0x11]);
    break;
  case 'C':
    *(ushort *)&in_RDI->m_updated = *(ushort *)&in_RDI->m_updated & 0xfffb | 4;
    (in_RDI->m_ecef_velocity).valid = true;
    local_24 = 0x14;
    break;
  case 'E':
    *(ushort *)&in_RDI->m_updated = *(ushort *)&in_RDI->m_updated & 0xfff7 | 8;
    (in_RDI->m_sw_version).valid = true;
    local_24 = 10;
    break;
  case 'J':
    *(ushort *)&in_RDI->m_updated = *(ushort *)&in_RDI->m_updated & 0xffef | 0x10;
    (in_RDI->m_single_position).valid = true;
    local_24 = 0x14;
    break;
  case 'U':
    *(ushort *)&in_RDI->m_updated = *(ushort *)&in_RDI->m_updated & 0xffbf | 0x40;
    (in_RDI->m_io_options).valid = true;
    local_24 = 4;
    break;
  case 'V':
    *(ushort *)&in_RDI->m_updated = *(ushort *)&in_RDI->m_updated & 0xff7f | 0x80;
    (in_RDI->m_enu_velocity).valid = true;
    local_24 = 0x14;
    break;
  case 0x83:
    *(ushort *)&in_RDI->m_updated = *(ushort *)&in_RDI->m_updated & 0xfffd | 2;
    (in_RDI->m_ecef_position_d).valid = true;
    local_24 = 0x28;
    break;
  case 0x84:
    *(ushort *)&in_RDI->m_updated = *(ushort *)&in_RDI->m_updated & 0xffdf | 0x20;
    (in_RDI->m_double_position).valid = true;
    local_24 = 0x14;
    break;
  case 0x8f:
    UVar1 = (in_RDI->m_report).raw.data[1];
    if (UVar1 == 0xa2) {
      *(ushort *)&in_RDI->m_updated = *(ushort *)&in_RDI->m_updated & 0xfbff | 0x400;
      (in_RDI->m_utc_gps_time).valid = true;
      (in_RDI->m_utc_gps_time).report.bits = *(_flags *)((in_RDI->m_report).raw.data + 2);
    }
    else if (UVar1 == 0xab) {
      *(ushort *)&in_RDI->m_updated = *(ushort *)&in_RDI->m_updated & 0xfeff | 0x100;
      (in_RDI->m_primary_time).valid = true;
      UVar3 = b4_to_uint32(in_RDI,0,'e');
      (in_RDI->m_primary_time).report.seconds_of_week = UVar3;
      UVar2 = b2_to_uint16(in_RDI,4,'e');
      (in_RDI->m_primary_time).report.week_number = UVar2;
      UVar2 = b2_to_uint16(in_RDI,6,'e');
      (in_RDI->m_primary_time).report.utc_offset = UVar2;
      (in_RDI->m_primary_time).report.flags = *(_flags *)((in_RDI->m_report).raw.data + 10);
      (in_RDI->m_primary_time).report.seconds = (in_RDI->m_report).raw.data[0xb];
      (in_RDI->m_primary_time).report.minutes = (in_RDI->m_report).raw.data[0xc];
      (in_RDI->m_primary_time).report.hours = (in_RDI->m_report).raw.data[0xd];
      (in_RDI->m_primary_time).report.day = (in_RDI->m_report).raw.data[0xe];
      (in_RDI->m_primary_time).report.month = (in_RDI->m_report).raw.data[0xf];
      UVar2 = b2_to_uint16(in_RDI,0xe,'e');
      (in_RDI->m_primary_time).report.year = UVar2;
    }
    else if (UVar1 == 0xac) {
      *(ushort *)&in_RDI->m_updated = *(ushort *)&in_RDI->m_updated & 0xfdff | 0x200;
      (in_RDI->m_secondary_time).valid = true;
      (in_RDI->m_secondary_time).report.receiver_mode = (in_RDI->m_report).raw.data[2];
      (in_RDI->m_secondary_time).report.disciplining_mode = (in_RDI->m_report).raw.data[3];
      (in_RDI->m_secondary_time).report.self_survey_progress = (in_RDI->m_report).raw.data[4];
      UVar3 = b4_to_uint32(in_RDI,3,'e');
      (in_RDI->m_secondary_time).report.holdover_duration = UVar3;
      UVar2 = b2_to_uint16(in_RDI,7,'e');
      (in_RDI->m_secondary_time).report.critical_alarms.value = UVar2;
      UVar2 = b2_to_uint16(in_RDI,9,'e');
      (in_RDI->m_secondary_time).report.minor_alarms.value = UVar2;
      (in_RDI->m_secondary_time).report.gps_decoding_status = (in_RDI->m_report).raw.data[0xd];
      (in_RDI->m_secondary_time).report.disciplining_activity = (in_RDI->m_report).raw.data[0xe];
      (in_RDI->m_secondary_time).report.spare_status1 = (in_RDI->m_report).raw.data[0xf];
      (in_RDI->m_secondary_time).report.spare_status2 = (in_RDI->m_report).raw.data[0x10];
      SVar4 = b4_to_single(in_RDI,0xf,'e');
      (in_RDI->m_secondary_time).report.pps_offset = SVar4;
      SVar4 = b4_to_single(in_RDI,0x13,'e');
      (in_RDI->m_secondary_time).report.tenMHz_offset = SVar4;
      UVar3 = b4_to_uint32(in_RDI,0x17,'e');
      (in_RDI->m_secondary_time).report.dac_value = UVar3;
      SVar4 = b4_to_single(in_RDI,0x1b,'e');
      (in_RDI->m_secondary_time).report.dac_voltage = SVar4;
      SVar4 = b4_to_single(in_RDI,0x1f,'e');
      (in_RDI->m_secondary_time).report.temperature = SVar4;
      DVar5 = b8_to_double(in_RDI,0x23,'e');
      (in_RDI->m_secondary_time).report.latitude = DVar5;
      DVar5 = b8_to_double(in_RDI,0x2b,'e');
      (in_RDI->m_secondary_time).report.longitude = DVar5;
      DVar5 = b8_to_double(in_RDI,0x33,'e');
      (in_RDI->m_secondary_time).report.altitude = DVar5;
      (in_RDI->m_secondary_time).report.spare[0] = (in_RDI->m_report).raw.data[0x3d];
      (in_RDI->m_secondary_time).report.spare[1] = (in_RDI->m_report).raw.data[0x3e];
      (in_RDI->m_secondary_time).report.spare[2] = (in_RDI->m_report).raw.data[0x3f];
      (in_RDI->m_secondary_time).report.spare[3] = (in_RDI->m_report).raw.data[0x40];
      (in_RDI->m_secondary_time).report.spare[4] = (in_RDI->m_report).raw.data[0x41];
      (in_RDI->m_secondary_time).report.spare[5] = (in_RDI->m_report).raw.data[0x42];
      (in_RDI->m_secondary_time).report.spare[6] = (in_RDI->m_report).raw.data[0x43];
      (in_RDI->m_secondary_time).report.spare[7] = (in_RDI->m_report).raw.data[0x44];
    }
    else {
      *(ushort *)&in_RDI->m_updated = *(ushort *)&in_RDI->m_updated & 0x7fff | 0x8000;
      (in_RDI->m_unknown).valid = true;
    }
  default:
    *(ushort *)&in_RDI->m_updated = *(ushort *)&in_RDI->m_updated & 0x7fff | 0x8000;
    (in_RDI->m_unknown).valid = true;
    local_24 = 0x400;
  }
  if (local_24 == 0) {
    local_4 = 0;
  }
  else {
    if ((in_RDI->debug & 1U) != 0) {
      printf("command buffer:\n");
      for (local_28 = 0; local_28 < 0x18; local_28 = local_28 + 1) {
        printf(" %x",(ulong)*(byte *)((long)&in_RDI->m_command + (long)local_28));
      }
      printf("\n");
      printf("\nreport buffer:\n");
      for (local_2c = 0; local_2c < in_RDI->m_report_length; local_2c = local_2c + 1) {
        printf(" %x",(ulong)*(byte *)((long)&in_RDI->m_report + (long)local_2c));
      }
      printf("\n");
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int tsip::update_report()
{
	void *src;
	void *dst;
	int  rlen = 0;

	if (verbose) printf("Found Report: %x-%x\n",m_report.report.code,m_report.extended.subcode);
	// save report
	switch (m_report.report.code) {

	case REPORT_ECEF_POSITION_S:
		m_updated.report.ecef_position_s = 1;
		m_ecef_position_s.valid = true;
		rlen = sizeof(m_ecef_position_s.report);

		m_ecef_position_s.report.x = (m_report.extended.data[0] << 24) + (m_report.extended.data[1] << 16) + (m_report.extended.data[2] << 8) + m_report.extended.data[3];
		m_ecef_position_s.report.y = (m_report.extended.data[4] << 24) + (m_report.extended.data[5] << 16) + (m_report.extended.data[6] << 8) + m_report.extended.data[7];
		m_ecef_position_s.report.z = (m_report.extended.data[8] << 24) + (m_report.extended.data[9] << 16) + (m_report.extended.data[10] << 8) + m_report.extended.data[11];
		m_ecef_position_s.report.time_of_fix = (m_report.extended.data[12] << 24) + (m_report.extended.data[13] << 16) + (m_report.extended.data[14] << 8) + m_report.extended.data[15];

		break;

	case REPORT_ECEF_POSITION_D:
		m_updated.report.ecef_position_d = 1;
		m_ecef_position_d.valid = true;
		src = m_report.report.data;
		dst = &m_ecef_position_d.report;
		rlen = sizeof(m_ecef_position_d.report);
		break;

	case REPORT_ECEF_VELOCITY:
		m_updated.report.ecef_velocity = 1;
		m_ecef_velocity.valid = true;
		src = m_report.report.data;
		dst = &m_ecef_velocity.report;
		rlen = sizeof(m_ecef_velocity.report);
		break;

	case REPORT_SW_VERSION:
		m_updated.report.sw_version = 1;
		m_sw_version.valid = true;
		src = m_report.report.data;
		dst = &m_sw_version.report;
		rlen = sizeof(m_sw_version.report);
		break;

	case REPORT_SINGLE_POSITION:
		m_updated.report.single_position = 1;
		m_single_position.valid = true;
		src = m_report.report.data;
		dst = &m_single_position.report;
		rlen = sizeof(m_single_position.report);
		break;

	case REPORT_DOUBLE_POSITION:
		m_updated.report.double_position = 1;
		m_double_position.valid = true;
		src = m_report.report.data;
		dst = &m_double_position.report;
		rlen = sizeof(m_single_position.report);
		break;

	case REPORT_IO_OPTIONS:
		m_updated.report.io_options = 1;
		m_io_options.valid = true;
		src = m_report.report.data;
		dst = &m_io_options.report;
		rlen = sizeof(m_io_options.report);
		break;

	case REPORT_ENU_VELOCITY:
		m_updated.report.enu_velocity = 1;
		m_enu_velocity.valid = true;
		src = m_report.report.data;
		dst = &m_enu_velocity.report;
		rlen = sizeof(m_enu_velocity.report);
		break;

	case REPORT_SUPER:
		switch (m_report.extended.subcode) {

		// 8f-a2
		case REPORT_SUPER_UTC_GPS_TIME:
			m_updated.report.utc_gps_time = 1;
			m_utc_gps_time.valid = true;
			rlen = sizeof(m_utc_gps_time.report);

			m_utc_gps_time.report.bits.value = m_report.extended.data[0];
			break;

		// 8f-ab
		case REPORT_SUPER_PRIMARY_TIME:
			m_updated.report.primary_time = 1;
			m_primary_time.valid = true;
			rlen = sizeof(m_primary_time.report);

			m_primary_time.report.seconds_of_week = b4_to_uint32(0,'e');
			m_primary_time.report.week_number = b2_to_uint16(4,'e');
			m_primary_time.report.utc_offset = b2_to_uint16(6,'e');
			m_primary_time.report.flags.value = m_report.extended.data[8];
			m_primary_time.report.seconds = m_report.extended.data[9];
			m_primary_time.report.minutes = m_report.extended.data[10];
			m_primary_time.report.hours = m_report.extended.data[11];
			m_primary_time.report.day = m_report.extended.data[12];
			m_primary_time.report.month = m_report.extended.data[13];
			m_primary_time.report.year = b2_to_uint16(14,'e');

			break;

		// 8f-ac
		case REPORT_SUPER_SECONDARY_TIME:
			m_updated.report.secondary_time = 1;
			m_secondary_time.valid = true;
			rlen = sizeof(m_secondary_time.report);

			m_secondary_time.report.receiver_mode = m_report.extended.data[0];
			m_secondary_time.report.disciplining_mode = m_report.extended.data[1];
			m_secondary_time.report.self_survey_progress = m_report.extended.data[2];
			m_secondary_time.report.holdover_duration = b4_to_uint32(3,'e');
			m_secondary_time.report.critical_alarms.value = b2_to_uint16(7,'e');
			m_secondary_time.report.minor_alarms.value = b2_to_uint16(9,'e');;
			m_secondary_time.report.gps_decoding_status = m_report.extended.data[11];
			m_secondary_time.report.disciplining_activity = m_report.extended.data[12];
			m_secondary_time.report.spare_status1 = m_report.extended.data[13];
			m_secondary_time.report.spare_status2 = m_report.extended.data[14];

			m_secondary_time.report.pps_offset = b4_to_single(15,'e');
			m_secondary_time.report.tenMHz_offset = b4_to_single(19,'e');
			m_secondary_time.report.dac_value = b4_to_uint32(23,'e');
			m_secondary_time.report.dac_voltage = b4_to_single(27,'e');
			m_secondary_time.report.temperature = b4_to_single(31,'e');

			m_secondary_time.report.latitude = b8_to_double(35,'e');
			m_secondary_time.report.longitude = b8_to_double(43,'e');
			m_secondary_time.report.altitude = b8_to_double(51,'e');

			m_secondary_time.report.spare[0] = m_report.extended.data[59];
			m_secondary_time.report.spare[1] = m_report.extended.data[60];
			m_secondary_time.report.spare[2] = m_report.extended.data[61];
			m_secondary_time.report.spare[3] = m_report.extended.data[62];
			m_secondary_time.report.spare[4] = m_report.extended.data[63];
			m_secondary_time.report.spare[5] = m_report.extended.data[64];
			m_secondary_time.report.spare[6] = m_report.extended.data[65];
			m_secondary_time.report.spare[7] = m_report.extended.data[66];
			break;

		default:
			m_updated.report.unknown = 1;
			m_unknown.valid = true;
		    src = m_report.raw.data;
			dst = m_unknown.report.raw.data;
			rlen = sizeof(m_unknown.report.raw.data);
			break;
		}

	default:
		m_updated.report.unknown = 1;
		m_unknown.valid = true;
	    src = m_report.raw.data;
		dst = m_unknown.report.raw.data;
		rlen = sizeof(m_unknown.report.raw.data);
        break;
	}

	// report strucute updated
	if (rlen > 0 ) {
		if (debug) {
			printf("command buffer:\n");
			for (int k=0;k<24;k++){printf(" %x",m_command.raw.data[k]);}
			printf("\n");
			printf("\nreport buffer:\n");
			for (int k=0;k<m_report_length;k++){printf(" %x",m_report.raw.data[k]);}
			printf("\n");
		}


		return 1;
	}


	return 0;
}